

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O0

void do_start_gesture_proc(Am_Object *param_1)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_String local_18;
  Am_Object *local_10;
  Am_Object *param_0_local;
  
  local_10 = param_1;
  Am_Object::Set(0x5530,0x169,0);
  pAVar2 = (Am_Value *)Am_Object::Get(0x5560,0x169);
  Am_String::Am_String(&local_18,pAVar2);
  bVar1 = Am_String::operator!=(&local_18,&training_mode);
  Am_String::~Am_String(&local_18);
  if (bVar1) {
    Am_Object::Set(0x5510,0x169,0);
  }
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_start_gesture, (Am_Object /*cmd*/))
{
  example_panel.Set(Am_VALUE, 0);

  if (Am_String(mode.Get(Am_VALUE)) != training_mode)
    class_panel.Set(Am_VALUE, 0);
}